

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O1

ecs_query_t * ecs_subquery_new(ecs_world_t *world,ecs_query_t *parent,char *expr)

{
  uint uVar1;
  ecs_query_t *query;
  undefined8 *puVar2;
  void *pvVar3;
  long lVar4;
  ecs_sig_t sig;
  ecs_sig_t local_48;
  
  local_48.name = (char *)0x0;
  local_48.expr = (char *)0x0;
  local_48.columns = (ecs_vector_t *)0x0;
  ecs_sig_init(world,(char *)0x0,expr,&local_48);
  query = ecs_query_new_w_sig_intern(world,0,&local_48,true);
  query->parent = parent;
  puVar2 = (undefined8 *)_ecs_vector_add(&parent->subqueries,8,0x10);
  *puVar2 = query;
  pvVar3 = _ecs_vector_first(parent->tables,0x50,0x10);
  uVar1 = ecs_vector_count(parent->tables);
  if (0 < (int)uVar1) {
    lVar4 = 0;
    do {
      match_table(world,query,*(ecs_table_t **)((long)pvVar3 + lVar4 + 8));
      activate_table(world,query,*(ecs_table_t **)((long)pvVar3 + lVar4 + 8),true);
      lVar4 = lVar4 + 0x50;
    } while ((ulong)uVar1 * 0x50 != lVar4);
  }
  pvVar3 = _ecs_vector_first(parent->empty_tables,0x50,0x10);
  uVar1 = ecs_vector_count(parent->empty_tables);
  if (0 < (int)uVar1) {
    lVar4 = 0;
    do {
      match_table(world,query,*(ecs_table_t **)((long)pvVar3 + lVar4 + 8));
      lVar4 = lVar4 + 0x50;
    } while ((ulong)uVar1 * 0x50 != lVar4);
  }
  return query;
}

Assistant:

ecs_query_t* ecs_subquery_new(
    ecs_world_t *world,
    ecs_query_t *parent,
    const char *expr)
{
    ecs_sig_t sig = { 0 };
    ecs_sig_init(world, NULL, expr, &sig);
    ecs_query_t *result = ecs_query_new_w_sig_intern(world, 0, &sig, true);
    result->parent = parent;
    add_subquery(world, parent, result);
    return result;
}